

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrPlaneDetectorLocationEXT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  XrGeneratedDispatchTable *pXVar6;
  XrPlaneDetectorLocationEXT *in_stack_fffffffffffffaf8;
  string type_prefix;
  string polygonbuffercount_prefix;
  string semantictype_prefix;
  string orientation_prefix;
  string extents_prefix;
  string pose_prefix;
  string locationflags_prefix;
  string planeid_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  undefined1 local_3c0 [32];
  string local_3a0;
  undefined1 local_380 [32];
  string local_360;
  string local_340;
  ostringstream oss_polygonBufferCount;
  ostringstream oss_planeId;
  
  PointerToHexString<XrPlaneDetectorLocationEXT>(in_stack_fffffffffffffaf8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_planeId);
  std::__cxx11::string::~string((string *)&oss_planeId);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_planeId,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_planeId);
    std::__cxx11::string::~string((string *)&oss_planeId);
  }
  else {
    _oss_planeId = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_planeId);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,(char (*) [64])&oss_planeId
              );
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_340,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_340,contents);
  std::__cxx11::string::~string((string *)&local_340);
  if (!bVar2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&planeid_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&planeid_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_planeId);
  poVar4 = std::operator<<((ostream *)&oss_planeId,"0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint64_t",&planeid_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_polygonBufferCount);
  std::__cxx11::string::~string((string *)&oss_polygonBufferCount);
  std::__cxx11::string::string((string *)&locationflags_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&locationflags_prefix);
  std::__cxx11::to_string((string *)&oss_polygonBufferCount,value->locationFlags);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[21],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [21])"XrSpaceLocationFlags",&locationflags_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_polygonBufferCount);
  std::__cxx11::string::~string((string *)&oss_polygonBufferCount);
  std::__cxx11::string::string((string *)&pose_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&pose_prefix);
  std::__cxx11::string::string((string *)(local_380 + 0x20),(string *)&pose_prefix);
  pXVar6 = (XrGeneratedDispatchTable *)local_380;
  std::__cxx11::string::string((string *)pXVar6,"XrPosef",(allocator *)&oss_polygonBufferCount);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar6,&value->pose,(string *)(local_380 + 0x20),(string *)local_380,false,
                     contents);
  std::__cxx11::string::~string((string *)local_380);
  std::__cxx11::string::~string((string *)(local_380 + 0x20));
  if (!bVar2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&extents_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&extents_prefix);
  std::__cxx11::string::string((string *)(local_3c0 + 0x20),(string *)&extents_prefix);
  pXVar6 = (XrGeneratedDispatchTable *)local_3c0;
  std::__cxx11::string::string((string *)pXVar6,"XrExtent2Df",(allocator *)&oss_polygonBufferCount);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar6,&value->extents,(string *)(local_3c0 + 0x20),(string *)local_3c0,false,
                     contents);
  std::__cxx11::string::~string((string *)local_3c0);
  std::__cxx11::string::~string((string *)(local_3c0 + 0x20));
  if (bVar2) {
    std::__cxx11::string::string((string *)&orientation_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&orientation_prefix);
    std::__cxx11::to_string((string *)&oss_polygonBufferCount,value->orientation);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[30],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [30])"XrPlaneDetectorOrientationEXT",&orientation_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_polygonBufferCount);
    std::__cxx11::string::~string((string *)&oss_polygonBufferCount);
    std::__cxx11::string::string((string *)&semantictype_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&semantictype_prefix);
    std::__cxx11::to_string((string *)&oss_polygonBufferCount,value->semanticType);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[31],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [31])"XrPlaneDetectorSemanticTypeEXT",&semantictype_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_polygonBufferCount);
    std::__cxx11::string::~string((string *)&oss_polygonBufferCount);
    std::__cxx11::string::string((string *)&polygonbuffercount_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&polygonbuffercount_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_polygonBufferCount);
    poVar4 = std::operator<<((ostream *)&oss_polygonBufferCount,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&polygonbuffercount_prefix,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_polygonBufferCount);
    std::__cxx11::string::~string((string *)&polygonbuffercount_prefix);
    std::__cxx11::string::~string((string *)&semantictype_prefix);
    std::__cxx11::string::~string((string *)&orientation_prefix);
    std::__cxx11::string::~string((string *)&extents_prefix);
    std::__cxx11::string::~string((string *)&pose_prefix);
    std::__cxx11::string::~string((string *)&locationflags_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_planeId);
    std::__cxx11::string::~string((string *)&planeid_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPlaneDetectorLocationEXT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string planeid_prefix = prefix;
        planeid_prefix += "planeId";
        std::ostringstream oss_planeId;
        oss_planeId << "0x" << std::hex << (value->planeId);
        contents.emplace_back("uint64_t", planeid_prefix, oss_planeId.str());
        std::string locationflags_prefix = prefix;
        locationflags_prefix += "locationFlags";
        contents.emplace_back("XrSpaceLocationFlags", locationflags_prefix, std::to_string(value->locationFlags));
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string extents_prefix = prefix;
        extents_prefix += "extents";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->extents, extents_prefix, "XrExtent2Df", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string orientation_prefix = prefix;
        orientation_prefix += "orientation";
        contents.emplace_back("XrPlaneDetectorOrientationEXT", orientation_prefix, std::to_string(value->orientation));
        std::string semantictype_prefix = prefix;
        semantictype_prefix += "semanticType";
        contents.emplace_back("XrPlaneDetectorSemanticTypeEXT", semantictype_prefix, std::to_string(value->semanticType));
        std::string polygonbuffercount_prefix = prefix;
        polygonbuffercount_prefix += "polygonBufferCount";
        std::ostringstream oss_polygonBufferCount;
        oss_polygonBufferCount << "0x" << std::hex << (value->polygonBufferCount);
        contents.emplace_back("uint32_t", polygonbuffercount_prefix, oss_polygonBufferCount.str());
        return true;
    } catch(...) {
    }
    return false;
}